

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlResponsePoller.cpp
# Opt level: O2

ControlledPollAction __thiscall
aeron::archive::ControlResponsePoller::onFragment
          (ControlResponsePoller *this,AtomicBuffer *buffer,index_t offset,index_t length,
          Header *header)

{
  ushort uVar1;
  Value VVar2;
  ArchiveException *this_00;
  char *pcVar3;
  allocator local_ea;
  allocator local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  ControlResponse msg;
  MessageHeader hdr;
  
  hdr.m_buffer = (char *)0x0;
  hdr.m_offset = 0;
  io::aeron::archive::codecs::MessageHeader::reset
            (&hdr,(char *)buffer->m_buffer,(long)offset,(long)(int)buffer->m_length,0);
  uVar1 = *(ushort *)(hdr.m_buffer + hdr.m_offset + 2);
  if (uVar1 != 0x16) {
    if (uVar1 != 1) {
      this_00 = (ArchiveException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_e8,(uint)uVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg,
                     "unknown template id: ",&local_e8);
      std::__cxx11::string::string
                ((string *)&local_a8,
                 "ControlledPollAction aeron::archive::ControlResponsePoller::onFragment(concurrent::AtomicBuffer &, util::index_t, util::index_t, Header &)"
                 ,&local_e9);
      pcVar3 = aeron::util::past_prefix
                         ("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/ControlResponsePoller.cpp"
                         );
      std::__cxx11::string::string((string *)&local_c8,pcVar3,&local_ea);
      ArchiveException::ArchiveException(this_00,(string *)&msg,&local_a8,&local_c8,0x55);
      __cxa_throw(this_00,&ArchiveException::typeinfo,
                  aeron::util::SourcedException::~SourcedException);
    }
    msg.m_offset = 0;
    msg.m_buffer = (char *)0x0;
    msg.m_bufferLength = 0;
    io::aeron::archive::codecs::ControlResponse::reset
              (&msg,(char *)buffer->m_buffer,(long)offset + 8,(long)(int)buffer->m_length,
               (ulong)*(ushort *)(hdr.m_buffer + hdr.m_offset),
               (ulong)*(ushort *)(hdr.m_buffer + hdr.m_offset + 6));
    this->controlSessionId_ = *(int64_t *)(msg.m_buffer + msg.m_offset);
    this->correlationId_ = *(int64_t *)(msg.m_buffer + msg.m_offset + 8);
    this->relevantId_ = *(int64_t *)(msg.m_buffer + msg.m_offset + 0x10);
    this->templateId_ = 1;
    VVar2 = io::aeron::archive::codecs::ControlResponse::code(&msg);
    this->code_ = VVar2;
    if (VVar2 == ERROR) {
      io::aeron::archive::codecs::ControlResponse::getErrorMessageAsString_abi_cxx11_
                (&local_e8,&msg);
      std::__cxx11::string::_M_assign((string *)&this->errorMessage_);
      std::__cxx11::string::~string((string *)&local_e8);
    }
    else {
      std::__cxx11::string::assign((char *)&this->errorMessage_);
    }
  }
  this->isPollComplete_ = true;
  return BREAK;
}

Assistant:

ControlledPollAction ControlResponsePoller::onFragment(concurrent::AtomicBuffer& buffer, util::index_t offset,
                                                       util::index_t length, Header& header) {
    codecs::MessageHeader hdr;
    hdr.wrap((char*)buffer.buffer(), offset, 0, buffer.capacity());

    const std::uint16_t templateId = hdr.templateId();

    if (templateId == codecs::ControlResponse::sbeTemplateId()) {
        codecs::ControlResponse msg;
        msg.wrapForDecode((char*)buffer.buffer(), offset + hdr.encodedLength(), hdr.blockLength(), hdr.version(),
                          buffer.capacity());

        controlSessionId_ = msg.controlSessionId();
        correlationId_ = msg.correlationId();
        relevantId_ = msg.relevantId();
        templateId_ = templateId;
        code_ = msg.code();

        if (code_ == codecs::ControlResponseCode::ERROR) {
            errorMessage_ = msg.getErrorMessageAsString();
        } else {
            errorMessage_ = "";
        }
    } else if (templateId != codecs::RecordingDescriptor::sbeTemplateId()) {
        throw ArchiveException("unknown template id: " + std::to_string(templateId), SOURCEINFO);
    }

    isPollComplete_ = true;

    return ControlledPollAction::BREAK;
}